

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O1

void __thiscall
cli::Parser::set_callback<bool>
          (Parser *this,string *name,string *alternative,
          function<bool_(cli::CallbackArgs_&)> *callback,string *description,bool dominant)

{
  CmdBase *this_00;
  CmdBase *local_38;
  
  this_00 = (CmdBase *)operator_new(0xd8);
  CmdBase::CmdBase(this_00,name,alternative,description,false,dominant,false);
  this_00->_vptr_CmdBase = (_func_int **)&PTR__CmdFunction_00127ac8;
  this_00[1]._vptr_CmdBase = (_func_int **)0x0;
  this_00[1].name._M_dataplus._M_p = (pointer)0x0;
  this_00[1].name._M_string_length = 0;
  this_00[1].name.field_2._M_allocated_capacity = 0;
  std::function<bool_(cli::CallbackArgs_&)>::operator=
            ((function<bool_(cli::CallbackArgs_&)> *)(this_00 + 1),callback);
  local_38 = this_00;
  std::vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>>::
  emplace_back<cli::Parser::CmdBase*>
            ((vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>> *)&this->_commands
             ,&local_38);
  return;
}

Assistant:

void set_callback(const std::string& name, const std::string& alternative, std::function<T(CallbackArgs&)> callback, const std::string& description = "", bool dominant = false) {
			auto command = new CmdFunction<T> { name, alternative, description, false, dominant };
			command->callback = callback;
			_commands.push_back(command);
		}